

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_1bf255::ShellTool::configureAttribute
          (ShellTool *this,ConfigureContext *ctx,StringRef name,StringRef value)

{
  Child LHS;
  Child CVar1;
  Child CVar2;
  Child CVar3;
  Child CVar4;
  Child CVar5;
  NodeKind NVar6;
  Child CVar7;
  bool bVar8;
  Child local_f8 [2];
  undefined2 local_e8;
  undefined6 uStack_e6;
  Child local_d8 [2];
  undefined2 local_c8;
  undefined6 uStack_c6;
  Twine local_b8;
  undefined4 local_98;
  undefined4 uStack_94;
  NodeKind local_88;
  char cStack_87;
  undefined6 uStack_86;
  uint local_80;
  undefined4 uStack_7c;
  NodeKind local_70;
  char cStack_6f;
  undefined6 uStack_6e;
  uint local_68;
  undefined4 uStack_64;
  NodeKind local_58;
  char cStack_57;
  undefined6 uStack_56;
  StringRef local_50;
  uint local_40;
  undefined4 uStack_3c;
  NodeKind local_30;
  char cStack_2f;
  undefined6 uStack_2e;
  StringRef local_28;
  
  local_28.Length = value.Length;
  local_28.Data = value.Data;
  local_50.Length = name.Length;
  local_50.Data = name.Data;
  if ((local_50.Length == 0xf) &&
     (*(long *)((long)local_50.Data + 7) == 0x64656c62616e652d &&
      *(long *)local_50.Data == 0x2d6c6f72746e6f63)) {
    if (((local_28.Length == 4) && (*(int *)local_28.Data == 0x65757274)) ||
       ((local_28.Length == 5 &&
        ((char)*(int *)((long)local_28.Data + 4) == 'e' && *(int *)local_28.Data == 0x736c6166)))) {
      if (local_28.Length == 4) {
        bVar8 = *(int *)local_28.Data == 0x65757274;
      }
      else {
        bVar8 = false;
      }
      this->controlEnabled = bVar8;
      return true;
    }
    llvm::Twine::Twine((Twine *)&local_40,"invalid value: \'",&local_28);
    llvm::Twine::Twine((Twine *)&local_68,"\' for attribute \'");
    if ((local_30 == NullKind) || (local_58 == NullKind)) {
      local_e8 = 0x100;
    }
    else if (local_30 == EmptyKind) {
      local_e8._1_1_ = cStack_57;
      local_e8._0_1_ = local_58;
      uStack_e6 = uStack_56;
      local_f8[0]._0_4_ = local_68;
      local_f8[0]._4_4_ = uStack_64;
    }
    else if (local_58 == EmptyKind) {
      local_e8._1_1_ = cStack_2f;
      local_e8._0_1_ = local_30;
      uStack_e6 = uStack_2e;
      local_f8[0]._0_4_ = local_40;
      local_f8[0]._4_4_ = uStack_3c;
    }
    else {
      CVar5._4_4_ = uStack_3c;
      CVar5.decUI = local_40;
      if (cStack_2f != '\x01') {
        local_30 = TwineKind;
        CVar5.twine = (Twine *)&local_40;
      }
      if (cStack_57 != '\x01') {
        local_58 = TwineKind;
      }
      CVar4._4_4_ = uStack_64;
      CVar4.decUI = local_68;
      CVar7.twine = (Twine *)&local_68;
      if (cStack_57 == '\x01') {
        CVar7 = CVar4;
      }
      llvm::Twine::Twine((Twine *)local_f8,CVar5,local_30,CVar7,local_58);
    }
    llvm::Twine::Twine((Twine *)&local_80,&local_50);
    if (((NodeKind)local_e8 == NullKind) || (local_70 == NullKind)) {
      local_c8 = 0x100;
    }
    else if ((NodeKind)local_e8 == EmptyKind) {
      local_c8._1_1_ = cStack_6f;
      local_c8._0_1_ = local_70;
      uStack_c6 = uStack_6e;
      local_d8[0]._0_4_ = local_80;
      local_d8[0]._4_4_ = uStack_7c;
    }
    else if (local_70 == EmptyKind) {
      local_c8._0_1_ = (NodeKind)local_e8;
      local_c8._1_1_ = local_e8._1_1_;
      uStack_c6 = uStack_e6;
      local_d8[0].decUI = local_f8[0].decUI;
      local_d8[0]._4_4_ = local_f8[0]._4_4_;
    }
    else {
      LHS._4_4_ = local_f8[0]._4_4_;
      LHS.decUI = local_f8[0].decUI;
      NVar6 = (NodeKind)local_e8;
      if (local_e8._1_1_ != EmptyKind) {
        LHS.twine = (Twine *)local_f8;
        NVar6 = TwineKind;
      }
      if (cStack_6f != '\x01') {
        local_70 = TwineKind;
      }
      CVar3._4_4_ = uStack_7c;
      CVar3.decUI = local_80;
      CVar7.twine = (Twine *)&local_80;
      if (cStack_6f == '\x01') {
        CVar7 = CVar3;
      }
      llvm::Twine::Twine((Twine *)local_d8,LHS,NVar6,CVar7,local_70);
    }
    llvm::Twine::Twine((Twine *)&local_98,"\'");
    if (((NodeKind)local_c8 == NullKind) || (local_88 == NullKind)) {
LAB_0015c8d5:
      local_b8._16_2_ = 0x100;
      goto LAB_0015c8f6;
    }
    if ((NodeKind)local_c8 == EmptyKind) {
      local_b8.RHSKind = cStack_87;
      local_b8.LHSKind = local_88;
      local_b8._18_6_ = uStack_86;
      goto LAB_0015c8f6;
    }
    if (local_88 == EmptyKind) {
      local_b8.LHSKind = (NodeKind)local_c8;
      local_b8.RHSKind = local_c8._1_1_;
      local_b8._18_6_ = uStack_c6;
      goto LAB_0015c8f6;
    }
    CVar7._4_4_ = local_d8[0]._4_4_;
    CVar7.decUI = local_d8[0].decUI;
    NVar6 = (NodeKind)local_c8;
    if (local_c8._1_1_ != EmptyKind) {
      CVar7.twine = (Twine *)local_d8;
      NVar6 = TwineKind;
    }
    if (cStack_87 != '\x01') {
      local_88 = TwineKind;
    }
    CVar2._4_4_ = uStack_94;
    CVar2.decUI = local_98;
    CVar5.twine = (Twine *)&local_98;
    if (cStack_87 == '\x01') {
      CVar5 = CVar2;
    }
  }
  else {
    llvm::Twine::Twine((Twine *)local_d8,"unexpected attribute: \'",&local_50);
    llvm::Twine::Twine((Twine *)local_f8,"\'");
    if (((NodeKind)local_c8 == NullKind) || ((NodeKind)local_e8 == NullKind)) goto LAB_0015c8d5;
    if ((NodeKind)local_c8 == EmptyKind) {
      local_b8.LHSKind = (NodeKind)local_e8;
      local_b8.RHSKind = local_e8._1_1_;
      local_b8._18_6_ = uStack_e6;
      goto LAB_0015c8f6;
    }
    if ((NodeKind)local_e8 == EmptyKind) {
      local_b8.LHSKind = (NodeKind)local_c8;
      local_b8.RHSKind = local_c8._1_1_;
      local_b8._18_6_ = uStack_c6;
      goto LAB_0015c8f6;
    }
    CVar7._4_4_ = local_d8[0]._4_4_;
    CVar7.decUI = local_d8[0].decUI;
    NVar6 = (NodeKind)local_c8;
    if (local_c8._1_1_ != EmptyKind) {
      CVar7.twine = (Twine *)local_d8;
      NVar6 = TwineKind;
    }
    local_88 = (NodeKind)local_e8;
    if (local_e8._1_1_ != EmptyKind) {
      local_88 = TwineKind;
    }
    CVar1._4_4_ = local_f8[0]._4_4_;
    CVar1.decUI = local_f8[0].decUI;
    CVar5.twine = (Twine *)local_f8;
    if (local_e8._1_1_ == EmptyKind) {
      CVar5 = CVar1;
    }
  }
  llvm::Twine::Twine(&local_b8,CVar7,NVar6,CVar5,local_88);
LAB_0015c8f6:
  llbuild::buildsystem::ConfigureContext::error(ctx,&local_b8);
  return false;
}

Assistant:

virtual bool configureAttribute(const ConfigureContext& ctx, StringRef name,
                                  StringRef value) override {
    if (name == "control-enabled") {
      if (value != "true" && value != "false") {
        ctx.error("invalid value: '" + value + "' for attribute '" +
                  name + "'");
        return false;
      }
      controlEnabled = (value == "true");
    } else {
      ctx.error("unexpected attribute: '" + name + "'");
      return false;
    }
    return true;
  }